

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<__int128,fmt::v6::basic_format_specs<char>>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,__int128 value,
          basic_format_specs<char> *spec)

{
  long in_RCX;
  int_writer<__int128,_fmt::v6::basic_format_specs<char>_> *in_stack_ffffffffffffff68;
  char spec_00;
  basic_format_specs<char> *in_stack_ffffffffffffff88;
  __int128 in_stack_ffffffffffffff90;
  basic_writer<fmt::v6::buffer_range<char>_> *in_stack_ffffffffffffffa0;
  int_writer<__int128,_fmt::v6::basic_format_specs<char>_> *in_stack_ffffffffffffffa8;
  
  spec_00 = *(char *)(in_RCX + 8);
  basic_writer<fmt::v6::buffer_range<char>_>::
  int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::int_writer
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>>
            (spec_00,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec.type, int_writer<T, Spec>(*this, value, spec));
  }